

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,true>
               (float *ldata,float *rdata,bool *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  float fVar1;
  float fVar2;
  unsigned_long *puVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      ExecuteFlatLoop<float,float,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,true>
                ();
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar10 = 0;
    do {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar3[uVar5];
      }
      uVar6 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar6 = count;
      }
      uVar9 = uVar6;
      if (uVar8 != 0) {
        uVar9 = uVar10;
        if (uVar8 == 0xffffffffffffffff) {
          if (uVar10 < uVar6) {
            fVar1 = *rdata;
            do {
              fVar2 = ldata[uVar9];
              bVar4 = Value::IsNan<float>(fVar2);
              if ((bVar4) && (bVar4 = Value::IsNan<float>(fVar1), bVar4)) {
                bVar4 = false;
              }
              else {
                bVar4 = (bool)(-(fVar2 != fVar1) & 1);
              }
              result_data[uVar9] = bVar4;
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
        }
        else if (uVar10 < uVar6) {
          uVar7 = 0;
          do {
            if ((uVar8 >> (uVar7 & 0x3f) & 1) != 0) {
              fVar1 = ldata[uVar10];
              fVar2 = *rdata;
              bVar4 = Value::IsNan<float>(fVar1);
              if ((bVar4) && (bVar4 = Value::IsNan<float>(fVar2), bVar4)) {
                bVar4 = false;
              }
              else {
                bVar4 = (bool)(-(fVar1 != fVar2) & 1);
              }
              result_data[uVar10] = bVar4;
            }
            uVar10 = uVar10 + 1;
            uVar7 = uVar7 + 1;
            uVar9 = uVar10;
          } while (uVar6 != uVar10);
        }
      }
      uVar5 = uVar5 + 1;
      uVar10 = uVar9;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}